

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O1

string * __thiscall
cmCPackNSISGenerator::CreateDeselectionDependenciesDescription_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackNSISGenerator *this,cmCPackComponent *component,
          set<cmCPackComponent_*,_std::less<cmCPackComponent_*>,_std::allocator<cmCPackComponent_*>_>
          *visited)

{
  _Rb_tree_header *p_Var1;
  pointer ppcVar2;
  cmCPackComponent *component_00;
  _Alloc_hider _Var3;
  ostream *poVar4;
  size_t sVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  pointer ppcVar8;
  ostringstream out;
  undefined1 auStack_1e8 [8];
  string *local_1e0;
  cmCPackNSISGenerator *local_1d8;
  string local_1d0;
  cmCPackComponent *local_1b0;
  undefined1 local_1a8 [376];
  
  p_Var1 = &(visited->_M_t)._M_impl.super__Rb_tree_header;
  p_Var7 = (visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var7 != (_Base_ptr)0x0;
      p_Var7 = (&p_Var7->_M_left)[*(cmCPackComponent **)(p_Var7 + 1) < component]) {
    if (*(cmCPackComponent **)(p_Var7 + 1) >= component) {
      p_Var6 = p_Var7;
    }
  }
  p_Var7 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
     (p_Var7 = p_Var6, component < *(cmCPackComponent **)(p_Var6 + 1))) {
    p_Var7 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var7 == p_Var1) {
    local_1e0 = __return_storage_ptr__;
    local_1d8 = this;
    local_1b0 = component;
    std::
    _Rb_tree<cmCPackComponent*,cmCPackComponent*,std::_Identity<cmCPackComponent*>,std::less<cmCPackComponent*>,std::allocator<cmCPackComponent*>>
    ::_M_insert_unique<cmCPackComponent*const&>
              ((_Rb_tree<cmCPackComponent*,cmCPackComponent*,std::_Identity<cmCPackComponent*>,std::less<cmCPackComponent*>,std::allocator<cmCPackComponent*>>
                *)visited,&local_1b0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ppcVar8 = (local_1b0->ReverseDependencies).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppcVar2 = (local_1b0->ReverseDependencies).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppcVar8 != ppcVar2) {
      do {
        component_00 = *ppcVar8;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"  SectionGetFlags ${",0x14);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(component_00->Name)._M_dataplus._M_p,
                            (component_00->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} $0\n",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"  IntOp $1 ${SF_SELECTED} ~\n",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"  IntOp $0 $0 & $1\n",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"  SectionSetFlags ${",0x14);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(component_00->Name)._M_dataplus._M_p,
                            (component_00->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} $0\n",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  IntOp $",9);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(component_00->Name)._M_dataplus._M_p,
                            (component_00->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_selected 0 + 0\n",0x10);
        CreateDeselectionDependenciesDescription_abi_cxx11_
                  (&local_1d0,local_1d8,component_00,visited);
        _Var3._M_p = local_1d0._M_dataplus._M_p;
        if (local_1d0._M_dataplus._M_p == (char *)0x0) {
          std::ios::clear((int)(auStack_1e8 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) + 0x40
                         );
        }
        else {
          sVar5 = strlen(local_1d0._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,_Var3._M_p,sVar5);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        ppcVar8 = ppcVar8 + 1;
      } while (ppcVar8 != ppcVar2);
    }
    __return_storage_ptr__ = local_1e0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackNSISGenerator::CreateDeselectionDependenciesDescription(
  cmCPackComponent* component, std::set<cmCPackComponent*>& visited)
{
  // Don't visit a component twice
  if (visited.count(component)) {
    return {};
  }
  visited.insert(component);

  std::ostringstream out;
  for (cmCPackComponent* depend : component->ReverseDependencies) {
    // Write NSIS code to deselect this dependency
    out << "  SectionGetFlags ${" << depend->Name << "} $0\n";
    out << "  IntOp $1 ${SF_SELECTED} ~\n";
    out << "  IntOp $0 $0 & $1\n";
    out << "  SectionSetFlags ${" << depend->Name << "} $0\n";
    out << "  IntOp $" << depend->Name << "_selected 0 + 0\n";

    // Recurse
    out << this->CreateDeselectionDependenciesDescription(depend, visited)
             .c_str();
  }

  return out.str();
}